

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O1

char * buffer_reserve(Buffer *buffer,size_t len)

{
  char *pcVar1;
  BufferBlock *pBVar2;
  ulong uVar3;
  char *pcVar4;
  BufferBlock **ppBVar5;
  
  if (len != 0) {
    pcVar4 = (char *)buffer->block_size;
    pBVar2 = buffer->tail;
    if (pBVar2 != (BufferBlock *)0x0) {
      pcVar1 = (char *)pBVar2->bytes;
      uVar3 = 0;
      if (pcVar1 <= pcVar4) {
        uVar3 = (long)pcVar4 - (long)pcVar1;
      }
      if (len <= uVar3) {
        pBVar2->bytes = (size_t)(pcVar1 + len);
        buffer->total_bytes = buffer->total_bytes + len;
        if (pcVar4 < pcVar1 + len) {
          __assert_fail("buffer->tail->bytes <= blocksize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                        ,0x2cf,"char *buffer_reserve(Buffer *, const size_t)");
        }
        pcVar1 = pcVar1 + (long)pBVar2->data;
      }
      if (len <= uVar3) {
        return pcVar1;
      }
    }
    if (pcVar4 <= len) {
      pcVar4 = (char *)len;
    }
    pBVar2 = (BufferBlock *)(*buffer->m)((int)pcVar4 + 0x18,buffer->d);
    if (pBVar2 != (BufferBlock *)0x0) {
      pBVar2->data = (uint8 *)(pBVar2 + 1);
      pBVar2->bytes = len;
      pBVar2->next = (BufferBlock *)0x0;
      ppBVar5 = &buffer->tail->next;
      if (buffer->tail == (BufferBlock *)0x0) {
        ppBVar5 = &buffer->head;
      }
      *ppBVar5 = pBVar2;
      buffer->tail = pBVar2;
      buffer->total_bytes = buffer->total_bytes + len;
      return (char *)(pBVar2 + 1);
    }
  }
  return (char *)0x0;
}

Assistant:

char *buffer_reserve(Buffer *buffer, const size_t len)
{
    // note that we make the blocks bigger than blocksize when we have enough
    //  data to overfill a fresh block, to reduce allocations.
    const size_t blocksize = buffer->block_size;

    if (len == 0)
        return NULL;

    if (buffer->tail != NULL)
    {
        const size_t tailbytes = buffer->tail->bytes;
        const size_t avail = (tailbytes >= blocksize) ? 0 : blocksize - tailbytes;
        if (len <= avail)
        {
            buffer->tail->bytes += len;
            buffer->total_bytes += len;
            assert(buffer->tail->bytes <= blocksize);
            return (char *) buffer->tail->data + tailbytes;
        } // if
    } // if

    // need to allocate a new block (even if a previous block wasn't filled,
    //  so this buffer is contiguous).
    const size_t bytecount = len > blocksize ? len : blocksize;
    const size_t malloc_len = sizeof (BufferBlock) + bytecount;
    BufferBlock *item = (BufferBlock *) buffer->m(malloc_len, buffer->d);
    if (item == NULL)
        return NULL;

    item->data = ((uint8 *) item) + sizeof (BufferBlock);
    item->bytes = len;
    item->next = NULL;
    if (buffer->tail != NULL)
        buffer->tail->next = item;
    else
        buffer->head = item;
    buffer->tail = item;

    buffer->total_bytes += len;

    return (char *) item->data;
}